

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mbedtls_mpi_shift_l(mbedtls_mpi *X,size_t count)

{
  int iVar1;
  size_t sVar2;
  size_t in_RSI;
  undefined8 *in_RDI;
  size_t i;
  int ret;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar3;
  
  uVar3 = 0xffffff92;
  sVar2 = mbedtls_mpi_bitlen((mbedtls_mpi *)0x88e610);
  if ((sVar2 + in_RSI <= (ulong)*(ushort *)((long)in_RDI + 10) << 6) ||
     (iVar1 = mbedtls_mpi_grow((mbedtls_mpi *)CONCAT44(uVar3,in_stack_ffffffffffffffe8),
                               sVar2 + in_RSI), iVar1 == 0)) {
    iVar1 = 0;
    mbedtls_mpi_core_shift_l
              ((mbedtls_mpi_uint *)*in_RDI,(ulong)*(ushort *)((long)in_RDI + 10),in_RSI);
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_shift_l(mbedtls_mpi *X, size_t count)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;

    i = mbedtls_mpi_bitlen(X) + count;

    if (X->n * biL < i) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, BITS_TO_LIMBS(i)));
    }

    ret = 0;

    mbedtls_mpi_core_shift_l(X->p, X->n, count);
cleanup:

    return ret;
}